

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t attr_destroy(exr_context_t ctxt,exr_attribute_t *attr)

{
  exr_attr_float_vector_t *fv;
  exr_attr_preview_t *in_RSI;
  exr_context_t in_RDI;
  exr_attr_chlist_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  exr_attr_opaquedata_t *in_stack_00000010;
  exr_result_t rv;
  uint in_stack_ffffffffffffffe8;
  exr_result_t eVar1;
  
  eVar1 = 0;
  fv = (exr_attr_float_vector_t *)(ulong)*(uint *)((long)&in_RSI->rgba + 4);
  switch(fv) {
  case (exr_attr_float_vector_t *)0x0:
  case (exr_attr_float_vector_t *)0x1:
  case (exr_attr_float_vector_t *)0x2:
  case (exr_attr_float_vector_t *)0x4:
  case (exr_attr_float_vector_t *)0x5:
  case (exr_attr_float_vector_t *)0x6:
  case (exr_attr_float_vector_t *)0x7:
  case (exr_attr_float_vector_t *)0x8:
  case (exr_attr_float_vector_t *)0xa:
  case (exr_attr_float_vector_t *)0xb:
  case (exr_attr_float_vector_t *)0xc:
  case (exr_attr_float_vector_t *)0xd:
  case (exr_attr_float_vector_t *)0xe:
  case (exr_attr_float_vector_t *)0xf:
  case (exr_attr_float_vector_t *)0x10:
  case (exr_attr_float_vector_t *)0x12:
  case (exr_attr_float_vector_t *)0x15:
  case (exr_attr_float_vector_t *)0x16:
  case (exr_attr_float_vector_t *)0x17:
  case (exr_attr_float_vector_t *)0x18:
  case (exr_attr_float_vector_t *)0x19:
  case (exr_attr_float_vector_t *)0x1a:
  case (exr_attr_float_vector_t *)0x1b:
  case (exr_attr_float_vector_t *)0x1c:
  case (exr_attr_float_vector_t *)0x1d:
  case (exr_attr_float_vector_t *)0x1f:
    break;
  case (exr_attr_float_vector_t *)0x3:
    eVar1 = exr_attr_chlist_destroy(in_stack_00000008,unaff_retaddr);
    break;
  case (exr_attr_float_vector_t *)0x9:
    eVar1 = exr_attr_float_vector_destroy((exr_context_t)(ulong)in_stack_ffffffffffffffe8,fv);
    break;
  case (exr_attr_float_vector_t *)0x11:
    eVar1 = exr_attr_preview_destroy(in_RDI,in_RSI);
    break;
  case (exr_attr_float_vector_t *)0x13:
    eVar1 = exr_attr_string_destroy
                      ((exr_context_t)(ulong)in_stack_ffffffffffffffe8,(exr_attr_string_t *)fv);
    break;
  case (exr_attr_float_vector_t *)0x14:
    eVar1 = exr_attr_string_vector_destroy(in_RDI,(exr_attr_string_vector_t *)in_RSI);
    break;
  case (exr_attr_float_vector_t *)0x1e:
    eVar1 = exr_attr_opaquedata_destroy((exr_context_t)attr,in_stack_00000010);
  }
  (*in_RDI->free_fn)(in_RSI);
  return eVar1;
}

Assistant:

static exr_result_t
attr_destroy (exr_context_t ctxt, exr_attribute_t* attr)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    switch (attr->type)
    {
        case EXR_ATTR_CHLIST:
            rv = exr_attr_chlist_destroy (ctxt, attr->chlist);
            break;
        case EXR_ATTR_FLOAT_VECTOR:
            rv = exr_attr_float_vector_destroy (ctxt, attr->floatvector);
            break;
        case EXR_ATTR_PREVIEW:
            rv = exr_attr_preview_destroy (ctxt, attr->preview);
            break;
        case EXR_ATTR_STRING:
            rv = exr_attr_string_destroy (ctxt, attr->string);
            break;
        case EXR_ATTR_STRING_VECTOR:
            rv = exr_attr_string_vector_destroy (ctxt, attr->stringvector);
            break;
        case EXR_ATTR_OPAQUE:
            rv = exr_attr_opaquedata_destroy (ctxt, attr->opaque);
            break;
        case EXR_ATTR_BOX2I:
        case EXR_ATTR_BOX2F:
        case EXR_ATTR_CHROMATICITIES:
        case EXR_ATTR_COMPRESSION:
        case EXR_ATTR_ENVMAP:
        case EXR_ATTR_LINEORDER:
        case EXR_ATTR_DOUBLE:
        case EXR_ATTR_FLOAT:
        case EXR_ATTR_INT:
        case EXR_ATTR_KEYCODE:
        case EXR_ATTR_M33F:
        case EXR_ATTR_M33D:
        case EXR_ATTR_M44F:
        case EXR_ATTR_M44D:
        case EXR_ATTR_RATIONAL:
        case EXR_ATTR_TILEDESC:
        case EXR_ATTR_TIMECODE:
        case EXR_ATTR_V2I:
        case EXR_ATTR_V2F:
        case EXR_ATTR_V2D:
        case EXR_ATTR_V3I:
        case EXR_ATTR_V3F:
        case EXR_ATTR_V3D:
        case EXR_ATTR_DEEP_IMAGE_STATE:
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: break;
    }
    /* we don't care about the string because they were built into the
     * allocation block of the attribute as necessary */
    ctxt->free_fn (attr);
    return rv;
}